

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

iterator __thiscall
pbrt::
InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>::
insert<std::reverse_iterator<pbrt::ParsedParameter*const*>>
          (InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>
           *this,const_iterator pos,reverse_iterator<pbrt::ParsedParameter_*const_*> *first,
          reverse_iterator<pbrt::ParsedParameter_*const_*> *last)

{
  long lVar1;
  InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>
  *pIVar2;
  ParsedParameter **ppPVar3;
  ParsedParameter **ppPVar4;
  
  pIVar2 = *(InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>
             **)(this + 8);
  if (*(InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>
        **)(this + 8) ==
      (InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>
       *)0x0) {
    pIVar2 = this + 0x10;
  }
  if (pIVar2 + *(long *)(this + 0x58) * 8 !=
      (InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>
       *)pos) {
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/containers.h"
             ,0x1f5,"TODO");
  }
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::reserve((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             *)this,((long)first->current - (long)last->current >> 3) + *(long *)(this + 0x58));
  lVar1 = *(long *)(this + 0x58);
  ppPVar3 = first->current;
  pIVar2 = this + 0x10;
  if (*(InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>
        **)(this + 8) !=
      (InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>
       *)0x0) {
    pIVar2 = *(InlinedVector<pbrt::ParsedParameter*,8,pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>>
               **)(this + 8);
  }
  pIVar2 = pIVar2 + lVar1 * 8;
  ppPVar4 = ppPVar3;
  if (ppPVar3 != last->current) {
    do {
      ppPVar4 = ppPVar3 + -1;
      ppPVar3 = ppPVar3 + -1;
      *(ParsedParameter **)pIVar2 = *ppPVar4;
      pIVar2 = pIVar2 + 8;
    } while (ppPVar3 != last->current);
    ppPVar4 = first->current;
  }
  *(long *)(this + 0x58) = ((long)ppPVar4 - (long)ppPVar3 >> 3) + lVar1;
  return (iterator)pIVar2;
}

Assistant:

iterator insert(const_iterator pos, InputIt first, InputIt last) {
        if (pos == end()) {
            reserve(size() + (last - first));
            iterator pos = end(), startPos = end();
            for (auto iter = first; iter != last; ++iter, ++pos)
                alloc.template construct<T>(pos, *iter);
            nStored += last - first;
            return pos;
        } else {
            // TODO
            LOG_FATAL("TODO");
        }
    }